

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

Maybe<capnp::Capability::Client> * __thiscall
capnp::_::anon_unknown_0::MembranePolicyImpl::inboundCall
          (Maybe<capnp::Capability::Client> *__return_storage_ptr__,MembranePolicyImpl *this,
          uint64_t interfaceId,uint16_t methodId,Client target)

{
  Server *pSVar1;
  undefined6 in_register_0000000a;
  Own<capnp::ClientHook> OVar2;
  Own<capnp::Capability::Server> local_40;
  Client local_30;
  Disposer *local_20;
  long local_18;
  
  if ((int)CONCAT62(in_register_0000000a,methodId) == 1 && interfaceId == 0x9352e4e41f173917) {
    kj::heap<capnp::_::(anonymous_namespace)::ThingImpl,char_const(&)[8]>
              ((kj *)&local_20,(char (*) [8])"inbound");
    local_40.disposer = local_20;
    local_40.ptr = (Server *)(local_18 + 0x18);
    if (local_18 == 0) {
      local_40.ptr = (Server *)0x0;
    }
    local_18 = 0;
    OVar2 = Capability::Client::makeLocalClient(&local_30,&local_40);
    pSVar1 = local_40.ptr;
    if (local_40.ptr != (Server *)0x0) {
      local_40.ptr = (Server *)0x0;
      (**(local_40.disposer)->_vptr_Disposer)
                (local_40.disposer,
                 (_func_int *)((long)&pSVar1->_vptr_Server + (long)pSVar1->_vptr_Server[-2]),
                 OVar2.ptr);
    }
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.hook.disposer = local_30.hook.disposer;
    (__return_storage_ptr__->ptr).field_1.value.hook.ptr = local_30.hook.ptr;
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Capability::Client> inboundCall(uint64_t interfaceId, uint16_t methodId,
                                            Capability::Client target) override {
    if (interfaceId == capnp::typeId<Thing>() && methodId == 1) {
      return Capability::Client(kj::heap<ThingImpl>("inbound"));
    } else {
      return nullptr;
    }
  }